

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGValidateValue(xmlRelaxNGValidCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict define)

{
  uint uVar1;
  xmlRelaxNGValidStatePtr pxVar2;
  xmlChar *arg1;
  void *pvVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  xmlChar *pxVar8;
  xmlChar *pxVar9;
  byte bVar10;
  ulong uVar11;
  xmlRelaxNGValidErr err;
  byte *pbVar12;
  xmlRelaxNGDefinePtr_conflict pxVar13;
  xmlRelaxNGDefinePtr define_00;
  xmlRelaxNGDefinePtr *ppxVar14;
  bool bVar15;
  
LAB_00181175:
  switch(define->type) {
  case XML_RELAXNG_EMPTY:
    pbVar5 = ctxt->state->value;
    if (pbVar5 == (byte *)0x0) {
      return 0;
    }
    bVar10 = *pbVar5;
    if (bVar10 == 0) {
      return 0;
    }
    while( true ) {
      pbVar5 = pbVar5 + 1;
      if (0x20 < bVar10) {
        return -1;
      }
      if ((0x100002600U >> ((ulong)bVar10 & 0x3f) & 1) == 0) break;
      bVar10 = *pbVar5;
    }
    if ((ulong)bVar10 != 0) {
      return -1;
    }
    return 0;
  default:
    goto switchD_00181185_caseD_1;
  case XML_RELAXNG_EXCEPT:
    ppxVar14 = &define->content;
    do {
      pxVar13 = *ppxVar14;
      if (pxVar13 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 0;
      }
      iVar4 = xmlRelaxNGValidateValue(ctxt,pxVar13);
      ppxVar14 = &pxVar13->next;
    } while (iVar4 != 0);
    return -1;
  case XML_RELAXNG_TEXT:
    goto switchD_00181185_caseD_3;
  case XML_RELAXNG_DATATYPE:
    iVar4 = xmlRelaxNGValidateDatatype(ctxt,ctxt->state->value,define,ctxt->state->seq);
    if (iVar4 != 0) {
      return iVar4;
    }
    goto LAB_001812fd;
  case XML_RELAXNG_VALUE:
    pxVar9 = ctxt->state->value;
    iVar4 = xmlStrEqual(pxVar9,define->value);
    if (iVar4 != 0) goto LAB_001812fd;
    pxVar8 = define->name;
    if (pxVar8 == (xmlChar *)0x0) {
      pxVar8 = xmlRelaxNGNormalize(ctxt,define->value);
      pxVar9 = xmlRelaxNGNormalize(ctxt,pxVar9);
      if ((pxVar8 == (xmlChar *)0x0) || (pxVar9 == (xmlChar *)0x0)) {
        bVar15 = false;
        if (pxVar8 != (xmlChar *)0x0) goto LAB_0018159a;
      }
      else {
        iVar4 = xmlStrEqual(pxVar8,pxVar9);
        bVar15 = iVar4 != 0;
LAB_0018159a:
        (*xmlFree)(pxVar8);
      }
      if (pxVar9 != (xmlChar *)0x0) {
        (*xmlFree)(pxVar9);
      }
      if (!bVar15) {
        return -1;
      }
LAB_001812fd:
      xmlRelaxNGNextValue(ctxt);
      return 0;
    }
    pvVar3 = define->data;
    if ((pvVar3 != (void *)0x0) && (*(code **)((long)pvVar3 + 0x20) != (code *)0x0)) {
      iVar4 = (**(code **)((long)pvVar3 + 0x20))
                        (*(undefined8 *)((long)pvVar3 + 8),pxVar8,define->value,define->node,
                         define->attrs,pxVar9,ctxt->state->node);
      if (-1 < iVar4) {
        if (iVar4 != 1) {
          return -1;
        }
        goto LAB_001812fd;
      }
      pxVar8 = define->name;
    }
    err = XML_RELAXNG_ERR_TYPECMP;
    goto LAB_00181198;
  case XML_RELAXNG_LIST:
    pxVar8 = ctxt->state->value;
    pxVar9 = ctxt->state->endvalue;
    pxVar13 = define->content;
    pbVar6 = xmlStrdup(pxVar8);
    pbVar5 = pbVar6;
    if ((pbVar6 != (byte *)0x0) || (pbVar6 = xmlStrdup(""), pbVar5 = pbVar6, pbVar6 != (byte *)0x0))
    goto LAB_00181390;
    err = XML_RELAXNG_ERR_NOSTATE;
    goto LAB_00181192;
  case XML_RELAXNG_DEF:
  case XML_RELAXNG_GROUP:
    ppxVar14 = &define->content;
    do {
      pxVar13 = *ppxVar14;
      if (pxVar13 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 0;
      }
      iVar4 = xmlRelaxNGValidateValue(ctxt,pxVar13);
      ppxVar14 = &pxVar13->next;
    } while (iVar4 == 0);
    return -1;
  case XML_RELAXNG_REF:
  case XML_RELAXNG_PARENTREF:
    goto switchD_00181185_caseD_b;
  case XML_RELAXNG_OPTIONAL:
    pxVar8 = ctxt->state->value;
    if (pxVar8 == (xmlChar *)0x0) {
      return 0;
    }
    if (*pxVar8 == '\0') {
      return 0;
    }
    uVar1 = ctxt->flags;
    ctxt->flags = uVar1 | 1;
    iVar4 = xmlRelaxNGValidateValue(ctxt,define->content);
    ctxt->flags = uVar1;
    if (iVar4 != 0) {
      ctxt->state->value = pxVar8;
    }
    if (ctxt->errNr < 1) {
      return 0;
    }
    goto LAB_00181485;
  case XML_RELAXNG_ONEORMORE:
    iVar4 = xmlRelaxNGValidateValueList(ctxt,define->content);
    if (iVar4 != 0) {
      return iVar4;
    }
  case XML_RELAXNG_ZEROORMORE:
    pxVar8 = ctxt->state->value;
    if (pxVar8 == (xmlChar *)0x0) {
      return 0;
    }
    if (*pxVar8 == '\0') {
      return 0;
    }
    uVar1 = ctxt->flags;
    ctxt->flags = uVar1 | 1;
    pxVar8 = (xmlChar *)0x0;
    goto LAB_00181212;
  case XML_RELAXNG_CHOICE:
    pxVar8 = ctxt->state->value;
    define_00 = define->content;
    uVar1 = ctxt->flags;
    ctxt->flags = uVar1 | 1;
    iVar4 = 0;
  }
LAB_00181268:
  if (define_00 == (xmlRelaxNGDefinePtr_conflict)0x0) goto LAB_00181463;
  iVar4 = xmlRelaxNGValidateValue(ctxt,define_00);
  if (iVar4 == 0) {
    ctxt->flags = uVar1;
    goto LAB_0018147f;
  }
  ctxt->state->value = pxVar8;
  define_00 = define_00->next;
  goto LAB_00181268;
LAB_00181463:
  ctxt->flags = uVar1;
  if (iVar4 != 0) {
    if ((uVar1 & 1) == 0) {
      xmlRelaxNGDumpValidError(ctxt);
      return iVar4;
    }
    return iVar4;
  }
  goto LAB_0018147f;
switchD_00181185_caseD_b:
  define = define->content;
  if (define == (xmlRelaxNGDefinePtr)0x0) {
    err = XML_RELAXNG_ERR_NODEFINE;
LAB_00181192:
    pxVar8 = (xmlChar *)0x0;
LAB_00181198:
    xmlRelaxNGAddValidError(ctxt,err,pxVar8,(xmlChar *)0x0,0);
switchD_00181185_caseD_1:
    return -1;
  }
  goto LAB_00181175;
LAB_00181390:
  uVar11 = (ulong)*pbVar6;
  if (0x20 < uVar11) {
LAB_001813bc:
    pbVar6 = pbVar6 + 1;
    goto LAB_00181390;
  }
  pbVar7 = pbVar6;
  if ((0x100002600U >> (uVar11 & 0x3f) & 1) != 0) {
    do {
      pbVar6 = pbVar7 + 1;
      *pbVar7 = 0;
      if (0x20 < (ulong)*pbVar6) break;
      pbVar7 = pbVar6;
    } while ((0x100002600U >> ((ulong)*pbVar6 & 0x3f) & 1) != 0);
    goto LAB_00181390;
  }
  if (uVar11 != 0) goto LAB_001813bc;
  pxVar2 = ctxt->state;
  pxVar2->endvalue = pbVar6;
  pbVar7 = pbVar5;
  do {
    pbVar12 = pbVar7;
    if (pbVar12 == pbVar6) break;
    pbVar7 = pbVar12 + 1;
  } while (*pbVar12 == 0);
  pxVar2->value = pbVar12;
  while( true ) {
    pxVar2 = ctxt->state;
    arg1 = pxVar2->value;
    if (pxVar13 == (xmlRelaxNGDefinePtr_conflict)0x0) break;
    if (arg1 == pxVar2->endvalue) {
      pxVar2->value = (xmlChar *)0x0;
    }
    iVar4 = xmlRelaxNGValidateValue(ctxt,pxVar13);
    if (iVar4 != 0) goto LAB_001814ca;
    pxVar13 = pxVar13->next;
  }
  iVar4 = 0;
  if ((arg1 != (xmlChar *)0x0) && (arg1 != pxVar2->endvalue)) {
    xmlRelaxNGAddValidError(ctxt,XML_RELAXNG_ERR_LISTEXTRA,arg1,(xmlChar *)0x0,0);
    iVar4 = -1;
  }
LAB_001814ca:
  (*xmlFree)(pbVar5);
  pxVar2 = ctxt->state;
  pxVar2->value = pxVar8;
  pxVar2->endvalue = pxVar9;
  return iVar4;
  while (iVar4 = xmlRelaxNGValidateValueList(ctxt,define->content), pxVar8 = pxVar9, iVar4 == 0) {
LAB_00181212:
    pxVar9 = ctxt->state->value;
    if (((pxVar9 == (xmlChar *)0x0) || (pxVar8 == pxVar9)) || (pxVar9 == ctxt->state->endvalue))
    goto LAB_00181245;
  }
  ctxt->state->value = pxVar9;
LAB_00181245:
  ctxt->flags = uVar1;
LAB_0018147f:
  if (0 < ctxt->errNr) {
LAB_00181485:
    xmlRelaxNGPopErrors(ctxt,0);
    return 0;
  }
switchD_00181185_caseD_3:
  return 0;
}

Assistant:

static int
xmlRelaxNGValidateValue(xmlRelaxNGValidCtxtPtr ctxt,
                        xmlRelaxNGDefinePtr define)
{
    int ret = 0, oldflags;
    xmlChar *value;

    value = ctxt->state->value;
    switch (define->type) {
        case XML_RELAXNG_EMPTY:{
                if ((value != NULL) && (value[0] != 0)) {
                    int idx = 0;

                    while (IS_BLANK_CH(value[idx]))
                        idx++;
                    if (value[idx] != 0)
                        ret = -1;
                }
                break;
            }
        case XML_RELAXNG_TEXT:
            break;
        case XML_RELAXNG_VALUE:{
                if (!xmlStrEqual(value, define->value)) {
                    if (define->name != NULL) {
                        xmlRelaxNGTypeLibraryPtr lib;

                        lib = (xmlRelaxNGTypeLibraryPtr) define->data;
                        if ((lib != NULL) && (lib->comp != NULL)) {
                            ret = lib->comp(lib->data, define->name,
                                            define->value, define->node,
                                            (void *) define->attrs,
                                            value, ctxt->state->node);
                        } else
                            ret = -1;
                        if (ret < 0) {
                            VALID_ERR2(XML_RELAXNG_ERR_TYPECMP,
                                       define->name);
                            return (-1);
                        } else if (ret == 1) {
                            ret = 0;
                        } else {
                            ret = -1;
                        }
                    } else {
                        xmlChar *nval, *nvalue;

                        /*
                         * TODO: trivial optimizations are possible by
                         * computing at compile-time
                         */
                        nval = xmlRelaxNGNormalize(ctxt, define->value);
                        nvalue = xmlRelaxNGNormalize(ctxt, value);

                        if ((nval == NULL) || (nvalue == NULL) ||
                            (!xmlStrEqual(nval, nvalue)))
                            ret = -1;
                        if (nval != NULL)
                            xmlFree(nval);
                        if (nvalue != NULL)
                            xmlFree(nvalue);
                    }
                }
                if (ret == 0)
                    xmlRelaxNGNextValue(ctxt);
                break;
            }
        case XML_RELAXNG_DATATYPE:{
                ret = xmlRelaxNGValidateDatatype(ctxt, value, define,
                                                 ctxt->state->seq);
                if (ret == 0)
                    xmlRelaxNGNextValue(ctxt);

                break;
            }
        case XML_RELAXNG_CHOICE:{
                xmlRelaxNGDefinePtr list = define->content;
                xmlChar *oldvalue;

                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;

                oldvalue = ctxt->state->value;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret == 0) {
                        break;
                    }
                    ctxt->state->value = oldvalue;
                    list = list->next;
                }
                ctxt->flags = oldflags;
                if (ret != 0) {
                    if ((ctxt->flags & FLAGS_IGNORABLE) == 0)
                        xmlRelaxNGDumpValidError(ctxt);
                } else {
                    if (ctxt->errNr > 0)
                        xmlRelaxNGPopErrors(ctxt, 0);
                }
                break;
            }
        case XML_RELAXNG_LIST:{
                xmlRelaxNGDefinePtr list = define->content;
                xmlChar *oldvalue, *oldend, *val, *cur;

                oldvalue = ctxt->state->value;
                oldend = ctxt->state->endvalue;

                val = xmlStrdup(oldvalue);
                if (val == NULL) {
                    val = xmlStrdup(BAD_CAST "");
                }
                if (val == NULL) {
                    VALID_ERR(XML_RELAXNG_ERR_NOSTATE);
                    return (-1);
                }
                cur = val;
                while (*cur != 0) {
                    if (IS_BLANK_CH(*cur)) {
                        *cur = 0;
                        cur++;
                        while (IS_BLANK_CH(*cur))
                            *cur++ = 0;
                    } else
                        cur++;
                }
                ctxt->state->endvalue = cur;
                cur = val;
                while ((*cur == 0) && (cur != ctxt->state->endvalue))
                    cur++;

                ctxt->state->value = cur;

                while (list != NULL) {
                    if (ctxt->state->value == ctxt->state->endvalue)
                        ctxt->state->value = NULL;
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret != 0) {
                        break;
                    }
                    list = list->next;
                }

                if ((ret == 0) && (ctxt->state->value != NULL) &&
                    (ctxt->state->value != ctxt->state->endvalue)) {
                    VALID_ERR2(XML_RELAXNG_ERR_LISTEXTRA,
                               ctxt->state->value);
                    ret = -1;
                }
                xmlFree(val);
                ctxt->state->value = oldvalue;
                ctxt->state->endvalue = oldend;
                break;
            }
        case XML_RELAXNG_ONEORMORE:
            ret = xmlRelaxNGValidateValueList(ctxt, define->content);
            if (ret != 0) {
                break;
            }
            /* Falls through. */
        case XML_RELAXNG_ZEROORMORE:{
                xmlChar *cur, *temp;

                if ((ctxt->state->value == NULL) ||
                    (*ctxt->state->value == 0)) {
                    ret = 0;
                    break;
                }
                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;
                cur = ctxt->state->value;
                temp = NULL;
                while ((cur != NULL) && (cur != ctxt->state->endvalue) &&
                       (temp != cur)) {
                    temp = cur;
                    ret =
                        xmlRelaxNGValidateValueList(ctxt, define->content);
                    if (ret != 0) {
                        ctxt->state->value = temp;
                        ret = 0;
                        break;
                    }
                    cur = ctxt->state->value;
                }
                ctxt->flags = oldflags;
		if (ctxt->errNr > 0)
		    xmlRelaxNGPopErrors(ctxt, 0);
                break;
            }
        case XML_RELAXNG_OPTIONAL:{
                xmlChar *temp;

                if ((ctxt->state->value == NULL) ||
                    (*ctxt->state->value == 0)) {
                    ret = 0;
                    break;
                }
                oldflags = ctxt->flags;
                ctxt->flags |= FLAGS_IGNORABLE;
                temp = ctxt->state->value;
                ret = xmlRelaxNGValidateValue(ctxt, define->content);
                ctxt->flags = oldflags;
                if (ret != 0) {
                    ctxt->state->value = temp;
                    if (ctxt->errNr > 0)
                        xmlRelaxNGPopErrors(ctxt, 0);
                    ret = 0;
                    break;
                }
		if (ctxt->errNr > 0)
		    xmlRelaxNGPopErrors(ctxt, 0);
                break;
            }
        case XML_RELAXNG_EXCEPT:{
                xmlRelaxNGDefinePtr list;

                list = define->content;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret == 0) {
                        ret = -1;
                        break;
                    } else
                        ret = 0;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_DEF:
        case XML_RELAXNG_GROUP:{
                xmlRelaxNGDefinePtr list;

                list = define->content;
                while (list != NULL) {
                    ret = xmlRelaxNGValidateValue(ctxt, list);
                    if (ret != 0) {
                        ret = -1;
                        break;
                    } else
                        ret = 0;
                    list = list->next;
                }
                break;
            }
        case XML_RELAXNG_REF:
        case XML_RELAXNG_PARENTREF:
	    if (define->content == NULL) {
                VALID_ERR(XML_RELAXNG_ERR_NODEFINE);
                ret = -1;
	    } else {
                ret = xmlRelaxNGValidateValue(ctxt, define->content);
            }
            break;
        default:
            /* TODO */
            ret = -1;
    }
    return (ret);
}